

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<unsigned_short,_int,_duckdb::ParquetCastOperator>::Lookup
          (PrimitiveDictionary<unsigned_short,_int,_duckdb::ParquetCastOperator> *this,
          unsigned_short *value)

{
  primitive_dictionary_entry_t *ppVar1;
  ulong uVar2;
  
  uVar2 = (ulong)*value * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  uVar2 = uVar2 >> 0x20 ^ uVar2;
  while( true ) {
    uVar2 = uVar2 & this->capacity_mask;
    ppVar1 = this->dictionary + uVar2;
    if ((ppVar1->index == 0xffffffff) || (ppVar1->value == *value)) break;
    uVar2 = uVar2 + 1;
  }
  return ppVar1;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}